

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O2

bool __thiscall draco::PointAttribute::Reset(PointAttribute *this,size_t num_attribute_values)

{
  bool bVar1;
  int32_t iVar2;
  DataBuffer *this_00;
  pointer __p;
  long byte_stride;
  __uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> local_30;
  
  if ((this->attribute_buffer_)._M_t.
      super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>._M_t.
      super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
      super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl == (DataBuffer *)0x0) {
    this_00 = (DataBuffer *)operator_new(0x28);
    DataBuffer::DataBuffer(this_00);
    local_30._M_t.
    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
    super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl =
         (tuple<draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)
         (_Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>)0x0;
    std::__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::reset
              ((__uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
               &this->attribute_buffer_,this_00);
    std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
              ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)&local_30);
  }
  iVar2 = DataTypeLength((this->super_GeometryAttribute).data_type_);
  byte_stride = (long)iVar2 * (ulong)(this->super_GeometryAttribute).num_components_;
  bVar1 = DataBuffer::Update((this->attribute_buffer_)._M_t.
                             super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                             .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,
                             (void *)0x0,byte_stride * num_attribute_values);
  if (bVar1) {
    GeometryAttribute::ResetBuffer
              (&this->super_GeometryAttribute,
               (this->attribute_buffer_)._M_t.
               super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>.
               _M_t.
               super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>.
               super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl,byte_stride,0);
    this->num_unique_entries_ = (ValueType)num_attribute_values;
  }
  return bVar1;
}

Assistant:

bool PointAttribute::Reset(size_t num_attribute_values) {
  if (attribute_buffer_ == nullptr) {
    attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  }
  const int64_t entry_size = DataTypeLength(data_type()) * num_components();
  if (!attribute_buffer_->Update(nullptr, num_attribute_values * entry_size)) {
    return false;
  }
  // Assign the new buffer to the parent attribute.
  ResetBuffer(attribute_buffer_.get(), entry_size, 0);
  num_unique_entries_ = static_cast<uint32_t>(num_attribute_values);
  return true;
}